

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvar.c
# Opt level: O3

void nfvlookup(frameex1 *apframe1,DLword *achain,fnhead *apfnhead1)

{
  DLword *pfh;
  
  nnewframe(apframe1,achain,
            *(int *)((long)apfnhead1 +
                    (((long)(int)((ulong)((long)achain - (long)MachineState.pvar) >> 2) * 4 +
                     (ulong)(byte)*(ushort *)&apfnhead1->field_0xc * 2) -
                    (ulong)(*(ushort *)&apfnhead1->field_0xc >> 6 & 0xfffffffc))));
  return;
}

Assistant:

void nfvlookup(struct frameex1 *apframe1, DLword *achain,
               struct fnhead *apfnhead1)
/* pointer to current frame extension */
/* pointer to 1st word of the searching
   FVAR slot in CurrentFrameExtension */
/* pointer to current function header */
{
  DLword *pfh;  /* pointer to current function header */
  int paoffset; /* 2word offset in PVAR AREA */

  pfh = (DLword *)apfnhead1;
  paoffset = ((UNSIGNED)achain - (UNSIGNED)PVar) >> 2;
/* slot to looked for, 2word offset from PVar */
#ifdef BIGATOMS
  nnewframe(apframe1, achain, (*((LispPTR *)((DLword *)pfh + apfnhead1->fvaroffset) + paoffset -
                                 apfnhead1->nlocals)));
#else
  nnewframe(apframe1, achain,
            (GETWORD(pfh + (apfnhead1->fvaroffset + paoffset - apfnhead1->nlocals))));
#endif
}